

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

bool slang::ast::isWithinCovergroup(Symbol *field,Scope *usageScope)

{
  Symbol *pSVar1;
  Scope *local_28;
  Scope *scope;
  Scope *usageScope_local;
  Symbol *field_local;
  
  local_28 = Symbol::getParentScope(field);
  while( true ) {
    if (local_28 == (Scope *)0x0) {
      return false;
    }
    pSVar1 = Scope::asSymbol(local_28);
    if ((pSVar1->kind == CovergroupType) || (pSVar1->kind - CovergroupBody < 3)) break;
    pSVar1 = Scope::asSymbol(local_28);
    local_28 = Symbol::getParentScope(pSVar1);
  }
  return local_28 == usageScope;
}

Assistant:

static bool isWithinCovergroup(const Symbol& field, const Scope& usageScope) {
    const Scope* scope = field.getParentScope();
    while (scope) {
        switch (scope->asSymbol().kind) {
            case SymbolKind::CovergroupType:
            case SymbolKind::CovergroupBody:
            case SymbolKind::Coverpoint:
            case SymbolKind::CoverCross:
                return scope == &usageScope;
            default:
                scope = scope->asSymbol().getParentScope();
                break;
        }
    }
    return false;
}